

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# limbo.cpp
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_39dbd::phase_1_commitment
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          limbo_instance_t *instance,limbo_salt_t *salt,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *witness_out,
          vector<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
          *commitments,
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *witness_deltas,
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          *mult_deltas,
          vector<std::vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>,_std::allocator<std::vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>_>_>
          *output_broadcasts)

{
  uint8_t *puVar1;
  long lVar2;
  pointer pvVar3;
  pointer pvVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar5;
  ulong uVar6;
  long lVar7;
  size_t party;
  ulong uVar8;
  hash_context ctx;
  allocator_type local_159;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_158;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *local_150;
  ulong local_148;
  hash_context local_140;
  
  local_158 = __return_storage_ptr__;
  local_150 = witness_deltas;
  hash_init_prefix(&local_140,(ulong)instance->digest_size,'\x01');
  Keccak_HashUpdate(&local_140,salt->_M_elems,0x100);
  puVar1 = (witness_out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  hash_update(&local_140,puVar1,
              (long)(witness_out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
  uVar6 = 0;
  while (uVar6 < instance->num_rounds) {
    lVar7 = 8;
    local_148 = uVar6;
    for (uVar8 = 0; uVar8 < instance->num_MPC_parties; uVar8 = uVar8 + 1) {
      lVar2 = *(long *)&(commitments->
                        super__Vector_base<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<std::vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start[uVar6].
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ._M_impl.super__Vector_impl_data;
      puVar1 = *(uint8_t **)(lVar2 + -8 + lVar7);
      hash_update(&local_140,puVar1,*(long *)(lVar2 + lVar7) - (long)puVar1);
      lVar7 = lVar7 + 0x18;
    }
    pvVar3 = (output_broadcasts->
             super__Vector_base<std::vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>,_std::allocator<std::vector<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    puVar1 = *(uint8_t **)
              &pvVar3[uVar6].
               super__Vector_base<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
               ._M_impl.super__Vector_impl_data;
    hash_update(&local_140,puVar1,
                (long)*(pointer *)
                       ((long)&pvVar3[uVar6].
                               super__Vector_base<std::array<unsigned_long,_1UL>,_std::allocator<std::array<unsigned_long,_1UL>_>_>
                               ._M_impl.super__Vector_impl_data + 8) - (long)puVar1);
    pvVar4 = (local_150->
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    puVar1 = pvVar4[uVar6].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
    hash_update(&local_140,puVar1,
                (long)*(pointer *)
                       ((long)&pvVar4[uVar6].
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data + 8) - (long)puVar1);
    pvVar4 = (mult_deltas->
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    puVar1 = pvVar4[uVar6].super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
             .super__Vector_impl_data._M_start;
    hash_update(&local_140,puVar1,
                (long)*(pointer *)
                       ((long)&pvVar4[uVar6].
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data + 8) - (long)puVar1);
    uVar6 = local_148 + 1;
  }
  hash_final(&local_140);
  pvVar5 = local_158;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (local_158,(ulong)instance->digest_size,&local_159);
  puVar1 = (pvVar5->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  hash_squeeze(&local_140,puVar1,
               (long)(pvVar5->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)puVar1);
  return pvVar5;
}

Assistant:

std::vector<uint8_t> phase_1_commitment(
    const limbo_instance_t &instance, const limbo_salt_t &salt,
    const std::vector<uint8_t> &witness_out,
    const std::vector<std::vector<std::vector<uint8_t>>> &commitments,
    const std::vector<std::vector<uint8_t>> &witness_deltas,
    const std::vector<std::vector<uint8_t>> &mult_deltas,
    std::vector<std::vector<std::array<uint64_t, PARTY64>>>
        &output_broadcasts) {

  hash_context ctx;
  hash_init_prefix(&ctx, instance.digest_size, HASH_PREFIX_1);
  hash_update(&ctx, salt.data(), salt.size());
  hash_update(&ctx, witness_out.data(), witness_out.size());

  for (size_t repetition = 0; repetition < instance.num_rounds; repetition++) {
    for (size_t party = 0; party < instance.num_MPC_parties; party++) {
      hash_update(&ctx, commitments[repetition][party].data(),
                  commitments[repetition][party].size());
    }
    // dirty hack, need to check
    hash_update(&ctx, (uint8_t *)output_broadcasts[repetition].data(),
                PARTY64 * output_broadcasts[repetition].size() * 8);
    hash_update(&ctx, witness_deltas[repetition].data(),
                witness_deltas[repetition].size());
    hash_update(&ctx, mult_deltas[repetition].data(),
                mult_deltas[repetition].size());
  }
  hash_final(&ctx);

  std::vector<uint8_t> commitment(instance.digest_size);
  hash_squeeze(&ctx, commitment.data(), commitment.size());
  return commitment;
}